

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTrace.c
# Opt level: O2

void Sat_SolverTraceStop(sat_solver *pSat)

{
  FILE *__stream;
  uint uVar1;
  
  if ((FILE *)pSat->pFile != (FILE *)0x0) {
    rewind((FILE *)pSat->pFile);
    __stream = (FILE *)pSat->pFile;
    uVar1 = sat_solver_nvars(pSat);
    fprintf(__stream,"p %d %d %d",(ulong)uVar1,(ulong)(uint)pSat->nClauses,(ulong)(uint)pSat->nRoots
           );
    fclose((FILE *)pSat->pFile);
    pSat->pFile = (FILE *)0x0;
  }
  return;
}

Assistant:

void Sat_SolverTraceStop( sat_solver * pSat )
{
    if ( pSat->pFile == NULL )
        return;
    rewind( pSat->pFile );
    fprintf( pSat->pFile, "p %d %d %d", sat_solver_nvars(pSat), pSat->nClauses, pSat->nRoots );
    fclose( pSat->pFile );
    pSat->pFile = NULL;
}